

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.cpp
# Opt level: O2

raw_sstring_view
pstore::get_sstring_view
          (database *db,address addr,size_t length,
          not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> owner)

{
  uint uVar1;
  ulong uVar2;
  raw_sstring_view rVar3;
  undefined1 local_48 [24];
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> _Stack_30;
  unique_ptr<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  local_28;
  
  uVar1 = varint::encoded_size(length);
  uVar2 = 2;
  if (2 < uVar1) {
    uVar2 = (ulong)uVar1;
  }
  database::getro<char,void>((database *)local_48,(typed_address<char>)db,uVar2 + addr.a_);
  local_48._16_8_ = local_48._0_8_;
  _Stack_30._M_head_impl = (array<pstore::sat_entry,_65536UL> *)local_48._8_8_;
  local_48._0_8_ = (_func_int **)0x0;
  local_48._8_8_ =
       (__uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
        )0x0;
  local_28._M_t.
  super___uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
  .super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>._M_head_impl =
       (__uniq_ptr_data<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>,_true,_true>
        )(__uniq_ptr_data<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>,_true,_true>
          )length;
  sstring_view<std::shared_ptr<const_char>_>::operator=
            (owner.ptr_,(sstring_view<std::shared_ptr<const_char>_> *)(local_48 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  rVar3.size_ = length;
  rVar3.ptr_ = ((owner.ptr_)->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
  return rVar3;
}

Assistant:

raw_sstring_view get_sstring_view (database const & db, address const addr,
                                       std::size_t const length,
                                       gsl::not_null<shared_sstring_view *> const owner) {
        *owner =
            shared_sstring_view{db.getro (typed_address<char>::make (
                                              addr + std::max (varint::encoded_size (length), 2U)),
                                          length),
                                length};
        return {owner->data (), length};
    }